

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priest.c
# Opt level: O2

int pri_move(monst *priest)

{
  xchar x;
  xchar y;
  char cVar1;
  boolean bVar2;
  bool avoid;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  char cVar6;
  char cVar7;
  
  x = priest->mx;
  y = priest->my;
  bVar2 = histemple_at(priest,x,y);
  if (bVar2 == '\0') {
    return -1;
  }
  cVar1 = priest->field_0x75;
  cVar7 = priest->field_0x76;
  cVar6 = priest->field_0x77;
  uVar3 = mt_random();
  cVar7 = (char)((ulong)uVar3 % 3) + cVar7 + -1;
  uVar3 = mt_random();
  cVar6 = (char)((ulong)uVar3 % 3) + cVar6 + -1;
  if (((priest->field_0x62 & 0x40) == 0) ||
     ((u.uprops[0x15].extrinsic != 0 || u.uprops[0x15].intrinsic != 0 &&
      (iVar4 = resist(priest,'\x04',0,0), iVar4 == 0)))) {
    bVar2 = monnear(priest,(int)u.ux,(int)u.uy);
    if (bVar2 != '\0') {
      if (u.uprops[0x2d].extrinsic != 0) {
        pcVar5 = mon_nam(priest);
        pline("Your displaced image doesn\'t fool %s!",pcVar5);
      }
      mattacku(priest);
      return 0;
    }
    pcVar5 = strchr(u.urooms,(int)cVar1);
    if (pcVar5 == (char *)0x0) {
      avoid = true;
    }
    else {
      if (((*(uint *)&priest->field_0x60 >> 0x11 & 1) != 0) &&
         ((((youmonst.data != mons + 0x7b && youmonst.data != mons + 0x9e) &&
            (u.uprops[0xd].extrinsic == 0 && u.uprops[0xd].intrinsic == 0) ||
           (u.uprops[0xd].blocked != 0)) || ((priest->data->mflags1 & 0x1000000) != 0)))) {
        avoid = false;
        if (((*(uint *)&priest->field_0x60 >> 9 & 1) != 0) || ((u._1052_1_ & 0x22) != 0))
        goto LAB_00219d43;
        if ((viz_array[priest->my][priest->mx] & 1U) != 0) {
          cVar7 = u.ux;
          cVar6 = u.uy;
        }
      }
      avoid = false;
    }
  }
  else {
    avoid = u.uprops[0xd].blocked != 0 ||
            (youmonst.data != mons + 0x7b && youmonst.data != mons + 0x9e) &&
            (u.uprops[0xd].extrinsic == 0 && u.uprops[0xd].intrinsic == 0);
  }
LAB_00219d43:
  iVar4 = move_special(priest,'\0','\x01','\0',avoid,x,y,cVar7,cVar6);
  return iVar4;
}

Assistant:

int pri_move(struct monst *priest)
{
	xchar gx,gy,omx,omy;
	schar temple;
	boolean avoid = TRUE;

	omx = priest->mx;
	omy = priest->my;

	if (!histemple_at(priest, omx, omy)) return -1;

	temple = EPRI(priest)->shroom;

	gx = EPRI(priest)->shrpos.x;
	gy = EPRI(priest)->shrpos.y;

	gx += rn1(3,-1);	/* mill around the altar */
	gy += rn1(3,-1);

	if (!priest->mpeaceful ||
	   (Conflict && !resist(priest, RING_CLASS, 0, 0))) {
		if (monnear(priest, u.ux, u.uy)) {
			if (Displaced)
				pline("Your displaced image doesn't fool %s!",
					mon_nam(priest));
			mattacku(priest);
			return 0;
		} else if (strchr(u.urooms, temple)) {
			/* chase player if inside temple & can see him */
			if (priest->mcansee && m_canseeu(priest)) {
				gx = u.ux;
				gy = u.uy;
			}
			avoid = FALSE;
		}
	} else if (Invis) avoid = FALSE;

	return move_special(priest,FALSE,TRUE,FALSE,avoid,omx,omy,gx,gy);
}